

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
network::Network::sendSurvey
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Network *this,string *data,regex *reg)

{
  long lVar1;
  wait_op *op;
  function<void_(const_boost::system::error_code_&,_unsigned_long)> onRead;
  io_service service;
  mutable_buffers_1 local_508;
  deadline_timer timer;
  socket receivingSock;
  char buf [1024];
  
  boost::asio::io_context::io_context(&service);
  memset(buf,0,0x400);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sendBroadcast(this,data);
  timer.impl_.implementation_.timer_data.op_queue_.front_._0_4_ = 0;
  timer.impl_.implementation_.expiry.
  super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  .time_.time_count_.value_ =
       (base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
        )(time_rep_type)0x0;
  timer.impl_.implementation_.might_have_pending_waits = false;
  timer.impl_.implementation_._9_7_ = 0;
  timer.impl_.service_._2_2_ = this->port_ << 8 | this->port_ >> 8;
  timer.impl_.service_._0_2_ = 2;
  timer.impl_.service_._4_4_ = 0;
  boost::asio::
  basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_socket<boost::asio::io_context>
            ((basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)&receivingSock,&service,(endpoint_type *)&timer,(type *)0x0);
  onRead.super__Function_base._M_functor._M_unused._M_object = (void *)0x30d40;
  boost::asio::
  basic_deadline_timer<boost::posix_time::ptime,_boost::asio::time_traits<boost::posix_time::ptime>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_deadline_timer<boost::asio::io_context>
            (&timer,(io_context *)&service,(duration_type *)&onRead,(type *)0x0);
  onRead.super__Function_base._M_functor._M_unused._M_object = &local_508;
  lVar1 = CONCAT44(timer.impl_.service_._4_4_,
                   CONCAT22(timer.impl_.service_._2_2_,timer.impl_.service_._0_2_));
  local_508.super_mutable_buffer.data_ = (scheduler_operation *)&service;
  op = (wait_op *)boost::asio::asio_handler_allocate(0x60);
  (op->super_operation).next_ = (scheduler_operation *)0x0;
  (op->super_operation).func_ =
       boost::asio::detail::
       wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/network/network.cpp:67:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
       ::do_complete;
  (op->super_operation).task_result_ = 0;
  (op->ec_).val_ = 0;
  (op->ec_).failed_ = false;
  (op->ec_).cat_ =
       (error_category *)boost::system::detail::cat_holder<void>::system_category_instance;
  op[1].super_operation.next_ = (scheduler_operation *)local_508.super_mutable_buffer.data_;
  onRead.super__Function_base._M_functor._8_8_ = op;
  boost::asio::detail::
  handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
  ::handler_work_base((handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
                       *)&op[1].super_operation.func_,&timer.impl_.executor_);
  timer.impl_.implementation_.might_have_pending_waits = true;
  onRead.super__Function_base._M_manager = (_Manager_type)op;
  boost::asio::detail::epoll_reactor::
  schedule_timer<boost::asio::time_traits<boost::posix_time::ptime>>
            (*(epoll_reactor **)(lVar1 + 0x68),
             (timer_queue<boost::asio::time_traits<boost::posix_time::ptime>_> *)(lVar1 + 0x28),
             &timer.impl_.implementation_.expiry,&timer.impl_.implementation_.timer_data,op);
  onRead.super__Function_base._M_functor._8_8_ = 0;
  onRead.super__Function_base._M_manager = (_Manager_type)0x0;
  boost::asio::detail::
  wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/network/network.cpp:67:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::ptr::~ptr((ptr *)&onRead);
  onRead.super__Function_base._M_manager = (_Manager_type)0x0;
  onRead._M_invoker = (_Invoker_type)0x0;
  onRead.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  onRead.super__Function_base._M_functor._8_8_ = 0;
  onRead.super__Function_base._M_functor._M_unused._M_object = operator_new(0x28);
  local_508.super_mutable_buffer.data_ = buf;
  *(void **)onRead.super__Function_base._M_functor._M_unused._0_8_ =
       local_508.super_mutable_buffer.data_;
  *(regex **)((long)onRead.super__Function_base._M_functor._M_unused._0_8_ + 8) = reg;
  *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    **)((long)onRead.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
       __return_storage_ptr__;
  *(basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
    **)((long)onRead.super__Function_base._M_functor._M_unused._0_8_ + 0x18) =
       (basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
        *)&receivingSock;
  *(function<void_(const_boost::system::error_code_&,_unsigned_long)> **)
   ((long)onRead.super__Function_base._M_functor._M_unused._0_8_ + 0x20) = &onRead;
  onRead._M_invoker =
       std::
       _Function_handler<void_(const_boost::system::error_code_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/network/network.cpp:70:3)>
       ::_M_invoke;
  onRead.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_boost::system::error_code_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/network/network.cpp:70:3)>
       ::_M_manager;
  local_508.super_mutable_buffer.size_ = 0x400;
  boost::asio::
  basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::
  async_receive<boost::asio::mutable_buffers_1,std::function<void(boost::system::error_code_const&,unsigned_long)>&>
            ((basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              *)&receivingSock,&local_508,&onRead);
  boost::asio::io_context::run(&service);
  std::_Function_base::~_Function_base(&onRead.super__Function_base);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::time_traits<boost::posix_time::ptime>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl(&timer.impl_);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                     *)&receivingSock);
  boost::asio::execution_context::~execution_context(&service.super_execution_context);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> Network::sendSurvey(const std::string &data, const std::regex &reg)
{
	boost::asio::io_service service;
	char buf[PACKAGE_SIZE];
	memset(buf, 0, PACKAGE_SIZE);
	std::vector<std::string> responses;

	sendBroadcast(data);
	// Accept incoming connections that match the regular expression for 100ms
	udp::socket receivingSock(service, udp::endpoint(udp::v4(), port_));
	boost::asio::deadline_timer timer(service, boost::posix_time::milliseconds(200));
	timer.async_wait(
		[&service](const boost::system::error_code &ex) { service.stop(); }
	);
	std::function<void(const boost::system::error_code&, std::size_t)> onRead =
		[&](const boost::system::error_code &err, std::size_t read_bytes)
	{
		if (std::regex_match(buf, reg))
			responses.push_back(buf);

		memset(buf, 0, PACKAGE_SIZE);
		receivingSock.async_receive(boost::asio::buffer(buf, PACKAGE_SIZE), onRead);
	};
	receivingSock.async_receive(boost::asio::buffer(buf, PACKAGE_SIZE), onRead);

	service.run();
	return responses;
}